

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::setFontFamily(QTextEdit *this,QString *fontFamily)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QString> local_80;
  undefined1 local_68 [24];
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_68);
  pQVar1 = &((fontFamily->d).d)->super_QArrayData;
  pcVar2 = (fontFamily->d).ptr;
  qVar3 = (fontFamily->d).size;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_80.ptr = (QString *)
                 QArrayData::allocate((QArrayData **)&local_50.shared,0x18,0x10,1,KeepSize);
  local_80.d = (Data *)local_50.shared;
  ((local_80.ptr)->d).d = (Data *)pQVar1;
  ((local_80.ptr)->d).ptr = pcVar2;
  ((local_80.ptr)->d).size = qVar3;
  if (pQVar1 == (QArrayData *)0x0) {
    local_80.size = 1;
    ::QVariant::QVariant((QVariant *)&local_50,(QList_conflict *)&local_80);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x1fe7);
    ::QVariant::~QVariant((QVariant *)&local_50);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
  }
  else {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_80.size = 1;
    ::QVariant::QVariant((QVariant *)&local_50,(QList_conflict *)&local_80);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x1fe7);
    ::QVariant::~QVariant((QVariant *)&local_50);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  QWidgetTextControl::mergeCurrentCharFormat
            (*(QWidgetTextControl **)
              (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
              0x2f8),(QTextCharFormat *)local_68);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::setFontFamily(const QString &fontFamily)
{
    QTextCharFormat fmt;
    fmt.setFontFamilies({fontFamily});
    mergeCurrentCharFormat(fmt);
}